

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

double __thiscall r_exec::Group::update_sln(Group *this,View *v)

{
  ulong uVar1;
  uint16_t uVar2;
  int iVar3;
  double *pdVar4;
  _Mem *p_Var5;
  View *pVVar6;
  Group *pGVar7;
  Code *pCVar8;
  Mem *pMVar9;
  uint16_t uVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  
  if ((0 < this->decay_periods_to_go) && ((this->sln_decay != 0.0 || (NAN(this->sln_decay))))) {
    fVar12 = r_exec::View::get_sln(v);
    r_exec::View::mod_sln(v,(double)fVar12 * this->sln_decay);
  }
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0x18);
  fVar12 = (float)r_code::Atom::asFloat();
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[4])(this,0x17);
  fVar13 = (float)r_code::Atom::asFloat();
  dVar14 = r_exec::View::update_sln(v,(double)fVar12,(double)fVar13);
  this->avg_sln = this->avg_sln + dVar14;
  if (dVar14 < this->high_sln || dVar14 == this->high_sln) {
    if (this->low_sln <= dVar14) goto LAB_0016db21;
    pdVar4 = &this->low_sln;
  }
  else {
    pdVar4 = &this->high_sln;
  }
  *pdVar4 = dVar14;
LAB_0016db21:
  this->sln_updates = this->sln_updates + 1;
  iVar3 = (*(v->super_View).super__Object._vptr__Object[2])(v);
  if ((char)iVar3 == '\0') {
    uVar1 = v->periods_at_high_sln;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[4])(this,0x19);
    fVar12 = (float)r_code::Atom::asFloat();
    if ((fVar12 != (float)uVar1) || (NAN(fVar12) || NAN((float)uVar1))) {
      uVar1 = v->periods_at_low_sln;
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[4])(this,0x19);
      fVar12 = (float)r_code::Atom::asFloat();
      if ((fVar12 == (float)uVar1) && (!NAN(fVar12) && !NAN((float)uVar1))) {
        v->periods_at_low_sln = 0;
        uVar2 = get_ntf_grp_count(this);
        if (uVar2 != 0) {
          uVar10 = 1;
          do {
            p_Var5 = (_Mem *)r_code::Mem::Get();
            pVVar6 = (View *)operator_new(0x100);
            pGVar7 = get_ntf_grp(this,uVar10);
            pCVar8 = (Code *)operator_new(0x150);
            pMVar9 = (Mem *)r_code::Mem::Get();
            MkLowSln::MkLowSln((MkLowSln *)pCVar8,pMVar9,(Code *)(v->super_View).object.object);
            NotificationView::NotificationView
                      ((NotificationView *)pVVar6,(Code *)this,(Code *)pGVar7,pCVar8);
            _Mem::inject_notification(p_Var5,pVVar6,false);
            bVar11 = uVar10 != uVar2;
            uVar10 = uVar10 + 1;
          } while (bVar11);
        }
      }
    }
    else {
      v->periods_at_high_sln = 0;
      uVar2 = get_ntf_grp_count(this);
      if (uVar2 != 0) {
        uVar10 = 1;
        do {
          p_Var5 = (_Mem *)r_code::Mem::Get();
          pVVar6 = (View *)operator_new(0x100);
          pGVar7 = get_ntf_grp(this,uVar10);
          pCVar8 = (Code *)operator_new(0x150);
          pMVar9 = (Mem *)r_code::Mem::Get();
          MkHighSln::MkHighSln((MkHighSln *)pCVar8,pMVar9,(Code *)(v->super_View).object.object);
          NotificationView::NotificationView
                    ((NotificationView *)pVVar6,(Code *)this,(Code *)pGVar7,pCVar8);
          _Mem::inject_notification(p_Var5,pVVar6,false);
          bVar11 = uVar10 != uVar2;
          uVar10 = uVar10 + 1;
        } while (bVar11);
      }
    }
  }
  return dVar14;
}

Assistant:

double Group::update_sln(View *v)
{
    if (decay_periods_to_go > 0 && sln_decay != 0) {
        v->mod_sln(v->get_sln()*sln_decay);
    }

    double sln = v->update_sln(get_low_sln_thr(), get_high_sln_thr());
    avg_sln += sln;

    if (sln > high_sln) {
        high_sln = sln;
    } else if (sln < low_sln) {
        low_sln = sln;
    }

    ++sln_updates;

    if (!v->isNotification()) {
        if (v->periods_at_high_sln == get_sln_ntf_prd()) {
            v->periods_at_high_sln = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkHighSln(_Mem::Get(), v->object)), false);
            }
        } else if (v->periods_at_low_sln == get_sln_ntf_prd()) {
            v->periods_at_low_sln = 0;
            uint16_t ntf_grp_count = get_ntf_grp_count();

            for (uint16_t i = 1; i <= ntf_grp_count; ++i) {
                _Mem::Get()->inject_notification(new NotificationView(this, get_ntf_grp(i), new MkLowSln(_Mem::Get(), v->object)), false);
            }
        }
    }

    return sln;
}